

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_ge_table_set_globalz(size_t len,secp256k1_ge *a,secp256k1_fe *zr)

{
  long lVar1;
  secp256k1_fe *r;
  ulong uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  secp256k1_fe *a_00;
  size_t sVar11;
  long lVar12;
  ulong uVar13;
  secp256k1_gej *a_01;
  ulong uVar14;
  secp256k1_gej *r_00;
  secp256k1_ge *psVar15;
  secp256k1_fe *psVar16;
  secp256k1_fe zs;
  secp256k1_fe zi2;
  secp256k1_gej local_c8;
  
  sVar11 = len;
  psVar15 = a;
  psVar16 = zr;
  if (len != 0) {
    do {
      secp256k1_ge_verify(psVar15);
      secp256k1_fe_verify(psVar16);
      sVar11 = sVar11 - 1;
      psVar15 = psVar15 + 1;
      psVar16 = psVar16 + 1;
    } while (sVar11 != 0);
    lVar1 = len - 1;
    psVar16 = &a[lVar1].y;
    secp256k1_fe_verify(psVar16);
    uVar2 = a[lVar1].y.n[4];
    uVar10 = (uVar2 >> 0x30) * 0x1000003d1 + psVar16->n[0];
    uVar9 = (uVar10 >> 0x34) + a[lVar1].y.n[1];
    uVar13 = (uVar9 >> 0x34) + a[lVar1].y.n[2];
    uVar14 = (uVar13 >> 0x34) + a[lVar1].y.n[3];
    a_01 = (secp256k1_gej *)(uVar13 & 0xfffffffffffff);
    psVar16->n[0] = uVar10 & 0xfffffffffffff;
    a[lVar1].y.n[1] = uVar9 & 0xfffffffffffff;
    a[lVar1].y.n[2] = (uint64_t)a_01;
    a[lVar1].y.n[3] = uVar14 & 0xfffffffffffff;
    a[lVar1].y.n[4] = (uVar14 >> 0x34) + (uVar2 & 0xffffffffffff);
    a[lVar1].y.magnitude = 1;
    secp256k1_fe_verify(psVar16);
    local_c8.x.n[0] = zr[lVar1].n[0];
    local_c8.x.n[1] = zr[lVar1].n[1];
    local_c8.x.n[2] = zr[lVar1].n[2];
    local_c8.x.n[3] = (zr[lVar1].n + 2)[1];
    local_c8.x.n[4] = zr[lVar1].n[4];
    local_c8.x._40_8_ = (zr[lVar1].n + 4)[1];
    if (lVar1 != 0) {
      psVar15 = a + (len - 2);
      psVar16 = zr + len;
      lVar12 = 0;
      do {
        psVar16 = psVar16 + -1;
        if (lVar12 != 0) {
          a_01 = &local_c8;
          secp256k1_fe_mul(&local_c8.x,&local_c8.x,psVar16);
        }
        secp256k1_ge_verify(psVar15);
        r_00 = &local_c8;
        secp256k1_fe_verify(&local_c8.x);
        if (psVar15->infinity != 0) {
          secp256k1_ge_table_set_globalz_cold_1();
          secp256k1_gej_verify(a_01);
          if (a_01->infinity == 0) {
            if (a_00 != (secp256k1_fe *)0x0) {
              uVar3 = (a_01->y).n[0];
              uVar4 = (a_01->y).n[1];
              uVar5 = (a_01->y).n[2];
              uVar6 = (a_01->y).n[3];
              iVar7 = (a_01->y).magnitude;
              iVar8 = (a_01->y).normalized;
              a_00->n[4] = (a_01->y).n[4];
              a_00->magnitude = iVar7;
              a_00->normalized = iVar8;
              a_00->n[2] = uVar5;
              a_00->n[3] = uVar6;
              a_00->n[0] = uVar3;
              a_00->n[1] = uVar4;
              secp256k1_fe_verify(a_00);
              uVar2 = a_00->n[4];
              uVar10 = (uVar2 >> 0x30) * 0x1000003d1 + a_00->n[0];
              uVar9 = (uVar10 >> 0x34) + a_00->n[1];
              uVar13 = (uVar9 >> 0x34) + a_00->n[2];
              uVar14 = (uVar13 >> 0x34) + a_00->n[3];
              a_00->n[0] = uVar10 & 0xfffffffffffff;
              a_00->n[1] = uVar9 & 0xfffffffffffff;
              a_00->n[2] = uVar13 & 0xfffffffffffff;
              a_00->n[3] = uVar14 & 0xfffffffffffff;
              a_00->n[4] = (uVar14 >> 0x34) + (uVar2 & 0xffffffffffff);
              a_00->magnitude = 1;
              secp256k1_fe_verify(a_00);
            }
            secp256k1_gej_double(r_00,a_01);
            secp256k1_gej_verify(r_00);
            return;
          }
          secp256k1_gej_set_infinity(r_00);
          if (a_00 == (secp256k1_fe *)0x0) {
            return;
          }
          a_00->n[0] = 1;
          a_00->n[1] = 0;
          a_00->n[2] = 0;
          a_00->n[3] = 0;
          a_00->n[4] = 0;
          a_00->magnitude = 1;
          a_00->normalized = 1;
          secp256k1_fe_verify(a_00);
          return;
        }
        r = (secp256k1_fe *)(local_c8.z.n + 1);
        secp256k1_fe_sqr(r,&local_c8.x);
        secp256k1_fe_mul((secp256k1_fe *)(local_c8.y.n + 1),r,&local_c8.x);
        secp256k1_fe_mul(&psVar15->x,&psVar15->x,r);
        a_01 = (secp256k1_gej *)&psVar15->y;
        secp256k1_fe_mul((secp256k1_fe *)a_01,(secp256k1_fe *)a_01,
                         (secp256k1_fe *)(local_c8.y.n + 1));
        secp256k1_ge_verify(psVar15);
        lVar12 = lVar12 + 1;
        psVar15 = psVar15 + -1;
      } while (lVar1 != lVar12);
    }
    do {
      secp256k1_ge_verify(a);
      a = a + 1;
      len = len - 1;
    } while (len != 0);
  }
  return;
}

Assistant:

static void secp256k1_ge_table_set_globalz(size_t len, secp256k1_ge *a, const secp256k1_fe *zr) {
    size_t i;
    secp256k1_fe zs;
#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GE_VERIFY(&a[i]);
        SECP256K1_FE_VERIFY(&zr[i]);
    }
#endif

    if (len > 0) {
        i = len - 1;
        /* Ensure all y values are in weak normal form for fast negation of points */
        secp256k1_fe_normalize_weak(&a[i].y);
        zs = zr[i];

        /* Work our way backwards, using the z-ratios to scale the x/y values. */
        while (i > 0) {
            if (i != len - 1) {
                secp256k1_fe_mul(&zs, &zs, &zr[i]);
            }
            i--;
            secp256k1_ge_set_ge_zinv(&a[i], &a[i], &zs);
        }
    }

#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GE_VERIFY(&a[i]);
    }
#endif
}